

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> * __thiscall
testing::internal::
FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
AddNewExpectation(FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                  *this,char *file,int line,string *source_text,ArgumentMatcherTuple *m)

{
  Sequence *this_00;
  void *mock_obj;
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this_01;
  Sequence **ppSVar1;
  shared_ptr<testing::internal::ExpectationBase> untyped_expectation;
  Expectation local_50;
  shared_ptr<testing::internal::ExpectationBase> local_40;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  this_01 = (TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
             *)operator_new(0x130);
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
  TypedExpectation(this_01,this,file,line,source_text,m);
  std::__shared_ptr<testing::internal::ExpectationBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::internal::TypedExpectation<std::vector<unsigned_char,std::allocator<unsigned_char>>const&()>,void>
            ((__shared_ptr<testing::internal::ExpectationBase,(__gnu_cxx::_Lock_policy)2> *)
             &local_40,this_01);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&(this->super_UntypedFunctionMockerBase).untyped_expectations_,(value_type *)&local_40
             );
  ppSVar1 = ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_00 = *ppSVar1;
  if (this_00 != (Sequence *)0x0) {
    Expectation::Expectation(&local_50,&local_40);
    Sequence::AddExpectation(this_00,&local_50);
    Expectation::~Expectation(&local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return this_01;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    TypedExpectation<F>* const expectation =
        new TypedExpectation<F>(this, file, line, source_text, m);
    const std::shared_ptr<ExpectationBase> untyped_expectation(expectation);
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    untyped_expectations_.push_back(untyped_expectation);

    // Adds this expectation into the implicit sequence if there is one.
    Sequence* const implicit_sequence = g_gmock_implicit_sequence.get();
    if (implicit_sequence != nullptr) {
      implicit_sequence->AddExpectation(Expectation(untyped_expectation));
    }

    return *expectation;
  }